

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

uint __thiscall
capnp::compiler::NodeTranslator::StructLayout::Group::addData(Group *this,uint lgSize)

{
  RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> **ppRVar1;
  DataLocationUsage *pDVar2;
  DataLocationUsage *pDVar3;
  DataLocationUsage *pDVar4;
  RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> *pRVar5;
  uint uVar6;
  uint uVar7;
  DataLocation *pDVar8;
  ulong uVar9;
  size_t sVar10;
  ulong unaff_R12;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  DataLocationUsage local_4c;
  uint local_44;
  ulong local_40;
  Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> *local_38;
  
  if (this->hasMembers == false) {
    this->hasMembers = true;
    Union::newGroupAddingFirstMember(this->parent);
  }
  pDVar8 = (this->parent->dataLocations).builder.ptr;
  uVar9 = 0;
  if ((this->parent->dataLocations).builder.pos == pDVar8) {
    uVar12 = 0;
  }
  else {
    local_38 = &this->parentDataLocationUsage;
    uVar11 = 0xffffffff;
    local_40 = 0;
    unaff_R12 = uVar9;
    do {
      pDVar2 = (this->parentDataLocationUsage).builder.ptr;
      pDVar3 = (this->parentDataLocationUsage).builder.pos;
      if ((long)pDVar3 - (long)pDVar2 >> 3 == unaff_R12) {
        pDVar4 = (this->parentDataLocationUsage).builder.endPtr;
        if (pDVar3 == pDVar4) {
          sVar10 = (long)pDVar4 - (long)pDVar2 >> 2;
          if (pDVar4 == pDVar2) {
            sVar10 = 4;
          }
          kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::
          setCapacity(local_38,sVar10);
        }
        pRVar5 = (this->parentDataLocationUsage).builder.pos;
        pRVar5->isUsed = false;
        (pRVar5->holes).holes[0] = '\0';
        (pRVar5->holes).holes[1] = '\0';
        (pRVar5->holes).holes[2] = '\0';
        (pRVar5->holes).holes[3] = '\0';
        (pRVar5->holes).holes[4] = '\0';
        (pRVar5->holes).holes[5] = '\0';
        ppRVar1 = &(this->parentDataLocationUsage).builder.pos;
        *ppRVar1 = *ppRVar1 + 1;
      }
      uVar6 = (uint)unaff_R12;
      uVar9 = (ulong)lgSize;
      DataLocationUsage::smallestHoleAtLeast
                (&local_4c,(DataLocation *)((this->parentDataLocationUsage).builder.ptr + unaff_R12)
                 ,uVar6 * 8 + (int)(this->parent->dataLocations).builder.ptr);
      if ((local_4c.isUsed == true) && ((uint)local_4c.holes.holes._2_4_ < uVar11)) {
        local_40 = CONCAT71((int7)(uVar9 >> 8),1);
        uVar11 = local_4c.holes.holes._2_4_;
        local_44 = uVar6;
      }
      unaff_R12 = (ulong)(uVar6 + 1);
      pDVar8 = (this->parent->dataLocations).builder.ptr;
    } while (unaff_R12 <
             (ulong)((long)(this->parent->dataLocations).builder.pos - (long)pDVar8 >> 3));
    uVar9 = (ulong)local_44;
    uVar12 = local_40;
  }
  if ((uVar12 & 1) != 0) {
    uVar7 = DataLocationUsage::allocateFromHole
                      ((this->parentDataLocationUsage).builder.ptr + uVar9,this,pDVar8 + uVar9,
                       lgSize);
    unaff_R12 = (ulong)uVar7;
  }
  uVar7 = (uint)unaff_R12;
  if ((uVar12 & 1) == 0) {
    pDVar8 = (this->parent->dataLocations).builder.ptr;
    bVar13 = (this->parent->dataLocations).builder.pos != pDVar8;
    if (bVar13) {
      DataLocationUsage::tryAllocateByExpanding
                (&local_4c,(Group *)(this->parentDataLocationUsage).builder.ptr,(DataLocation *)this
                 ,(uint)pDVar8);
      if (local_4c.isUsed != false) {
        unaff_R12 = (ulong)(uint)local_4c.holes.holes._2_4_;
      }
      uVar7 = (uint)unaff_R12;
      if (local_4c.isUsed == false) {
        uVar11 = 1;
        do {
          uVar7 = (uint)unaff_R12;
          uVar12 = (ulong)uVar11;
          pDVar8 = (this->parent->dataLocations).builder.ptr;
          uVar9 = (long)(this->parent->dataLocations).builder.pos - (long)pDVar8 >> 3;
          bVar13 = uVar12 < uVar9;
          if (uVar9 <= uVar12) break;
          DataLocationUsage::tryAllocateByExpanding
                    (&local_4c,(Group *)((this->parentDataLocationUsage).builder.ptr + uVar12),
                     (DataLocation *)this,(int)pDVar8 + uVar11 * 8);
          if (local_4c.isUsed != false) {
            unaff_R12 = (ulong)(uint)local_4c.holes.holes._2_4_;
          }
          uVar7 = (uint)unaff_R12;
          uVar11 = uVar11 + 1;
        } while (local_4c.isUsed != true);
      }
    }
    if (!bVar13) {
      uVar7 = Union::addNewDataLocation(this->parent,lgSize);
      pDVar2 = (this->parentDataLocationUsage).builder.endPtr;
      if ((this->parentDataLocationUsage).builder.pos == pDVar2) {
        pDVar3 = (this->parentDataLocationUsage).builder.ptr;
        sVar10 = 4;
        if (pDVar2 != pDVar3) {
          sVar10 = (long)pDVar2 - (long)pDVar3 >> 2;
        }
        kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::
        setCapacity(&this->parentDataLocationUsage,sVar10);
      }
      pRVar5 = (this->parentDataLocationUsage).builder.pos;
      pRVar5->isUsed = true;
      pRVar5->lgSizeUsed = (uint8_t)lgSize;
      (pRVar5->holes).holes[0] = '\0';
      (pRVar5->holes).holes[1] = '\0';
      (pRVar5->holes).holes[2] = '\0';
      (pRVar5->holes).holes[3] = '\0';
      (pRVar5->holes).holes[4] = '\0';
      (pRVar5->holes).holes[5] = '\0';
      ppRVar1 = &(this->parentDataLocationUsage).builder.pos;
      *ppRVar1 = *ppRVar1 + 1;
    }
  }
  return uVar7;
}

Assistant:

uint addData(uint lgSize) override {
      addMember();

      uint bestSize = kj::maxValue;
      kj::Maybe<uint> bestLocation = kj::none;

      for (uint i = 0; i < parent.dataLocations.size(); i++) {
        // If we haven't seen this DataLocation yet, add a corresponding DataLocationUsage.
        if (parentDataLocationUsage.size() == i) {
          parentDataLocationUsage.add();
        }

        auto& usage = parentDataLocationUsage[i];
        KJ_IF_SOME(hole, usage.smallestHoleAtLeast(parent.dataLocations[i], lgSize)) {
          if (hole < bestSize) {
            bestSize = hole;
            bestLocation = i;
          }
        }
      }

      KJ_IF_SOME(best, bestLocation) {
        return parentDataLocationUsage[best].allocateFromHole(
            *this, parent.dataLocations[best], lgSize);
      }

      // There are no holes at all in the union big enough to fit this field.  Go back through all
      // of the locations and attempt to expand them to fit.
      for (uint i = 0; i < parent.dataLocations.size(); i++) {
        KJ_IF_SOME(result, parentDataLocationUsage[i].tryAllocateByExpanding(
            *this, parent.dataLocations[i], lgSize)) {
          return result;
        }
      }

      // Couldn't find any space in the existing locations, so add a new one.
      uint result = parent.addNewDataLocation(lgSize);
      parentDataLocationUsage.add(lgSize);
      return result;
    }